

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O0

void calc_kurt_all_cols<InputData<float,int>&,WorkerMemory<ImputedData<int,long_double>,long_double,float>&,long_double>
               (InputData<float,_int> *input_data,
               WorkerMemory<ImputedData<int,_long_double>,_long_double,_float> *workspace,
               ModelParams *model_params,double *kurtosis,double *saved_xmin,double *saved_xmax)

{
  bool bVar1;
  long lVar2;
  unsigned_long *puVar3;
  size_t in_RCX;
  size_t *in_RDX;
  undefined8 unaff_RBX;
  long in_RSI;
  long in_RDI;
  size_t in_R8;
  int *in_R9;
  double dVar4;
  Xoshiro256PP *unaff_retaddr;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_stack_00000008;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_stack_00000010;
  MissingAction in_stack_0000001c;
  float *in_stack_00000020;
  size_t in_stack_00000028;
  size_t in_stack_00000030;
  size_t *in_stack_00000038;
  MissingAction in_stack_0000004c;
  float *in_stack_00000050;
  float *in_stack_00000058;
  int *in_stack_00000060;
  float *in_stack_00000068;
  size_t in_stack_00000070;
  size_t *in_stack_00000078;
  size_t in_stack_00000080;
  size_t *in_stack_00000088;
  int *in_stack_00000090;
  MissingAction in_stack_00000098;
  int *in_stack_000000a0;
  size_t col;
  double *in_stack_ffffffffffffff18;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  ColumnSampler<long_double> *in_stack_ffffffffffffff28;
  undefined4 uVar6;
  ColumnSampler<long_double> *in_stack_ffffffffffffff30;
  double local_c8;
  size_t *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  int *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  InputData<float,_int> *in_stack_ffffffffffffff68;
  WorkerMemory<ImputedData<int,_long_double>,_long_double,_float> *in_stack_ffffffffffffff70;
  double *in_stack_ffffffffffffff80;
  MissingAction in_stack_ffffffffffffff88;
  CategSplit cat_split_type;
  Xoshiro256PP *rnd_generator;
  double *in_stack_ffffffffffffffb8;
  
  ColumnSampler<long_double>::prepare_full_pass(in_stack_ffffffffffffff30);
  do {
    while( true ) {
      bVar1 = ColumnSampler<long_double>::sample_col
                        (in_stack_ffffffffffffff28,
                         (size_t *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      if (!bVar1) {
        return;
      }
      if (in_R8 != 0) break;
LAB_004bbd72:
      if (*(ulong *)(in_RSI + 0x518) < *(ulong *)(in_RDI + 8)) {
        if (*(long *)(in_RDI + 0x68) == 0) {
          bVar1 = std::vector<double,_std::allocator<double>_>::empty
                            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30);
          if ((bVar1) &&
             (bVar1 = tsl::
                      robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                      ::empty((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                               *)0x4bbdd7), bVar1)) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4bbded);
            dVar4 = calc_kurtosis<float,long_double>
                              ((size_t *)in_stack_00000068,(size_t)in_stack_00000060,
                               (size_t)in_stack_00000058,in_stack_00000050,in_stack_0000004c);
            *(double *)(in_RCX + *(long *)(in_RSI + 0x518) * 8) = dVar4;
          }
          else {
            bVar1 = std::vector<double,_std::allocator<double>_>::empty
                              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30)
            ;
            if (bVar1) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4bbf2e);
              dVar4 = calc_kurtosis_weighted<float,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
                                (in_stack_00000038,in_stack_00000030,in_stack_00000028,
                                 in_stack_00000020,in_stack_0000001c,in_stack_00000010);
              *(double *)(in_RCX + *(long *)(in_RSI + 0x518) * 8) = dVar4;
            }
            else {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4bbe94);
              dVar4 = calc_kurtosis_weighted<float,std::vector<double,std::allocator<double>>,long_double>
                                (in_stack_00000038,in_stack_00000030,in_stack_00000028,
                                 in_stack_00000020,in_stack_0000001c,
                                 (vector<double,_std::allocator<double>_> *)in_stack_00000010);
              *(double *)(in_RCX + *(long *)(in_RSI + 0x518) * 8) = dVar4;
            }
          }
        }
        else {
          bVar1 = std::vector<double,_std::allocator<double>_>::empty
                            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30);
          if ((bVar1) &&
             (bVar1 = tsl::
                      robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                      ::empty((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                               *)0x4bbfee), bVar1)) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4bc004);
            in_stack_ffffffffffffff18 = *(double **)(in_RDI + 0x68);
            in_stack_ffffffffffffff20 = (undefined4)in_RDX[0x11];
            dVar4 = calc_kurtosis<float,int,long_double>
                              (in_stack_00000078,in_stack_00000070,(size_t)in_stack_00000068,
                               (size_t)in_stack_00000060,in_stack_00000058,(int *)in_stack_00000050,
                               in_stack_00000090,in_stack_00000098);
            *(double *)(in_RCX + *(long *)(in_RSI + 0x518) * 8) = dVar4;
          }
          else {
            bVar1 = std::vector<double,_std::allocator<double>_>::empty
                              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30)
            ;
            if (bVar1) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4bc163);
              in_stack_ffffffffffffff18 = *(double **)(in_RDI + 0x68);
              in_stack_ffffffffffffff20 = (undefined4)in_RDX[0x11];
              in_stack_ffffffffffffff28 = (ColumnSampler<long_double> *)(in_RSI + 0x80);
              dVar4 = calc_kurtosis_weighted<float,int,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
                                (in_stack_00000088,in_stack_00000080,(size_t)in_stack_00000078,
                                 in_stack_00000070,in_stack_00000068,in_stack_00000060,
                                 in_stack_000000a0,(MissingAction)col,
                                 (robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                                  *)saved_xmax);
              *(double *)(in_RCX + *(long *)(in_RSI + 0x518) * 8) = dVar4;
            }
            else {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4bc0b7);
              in_stack_ffffffffffffff18 = *(double **)(in_RDI + 0x68);
              in_stack_ffffffffffffff20 = (undefined4)in_RDX[0x11];
              in_stack_ffffffffffffff28 = (ColumnSampler<long_double> *)(in_RSI + 0xd0);
              dVar4 = calc_kurtosis_weighted<float,int,std::vector<double,std::allocator<double>>,long_double>
                                (in_stack_00000088,in_stack_00000080,(size_t)in_stack_00000078,
                                 in_stack_00000070,in_stack_00000068,in_stack_00000060,
                                 in_stack_000000a0,(MissingAction)col,
                                 (vector<double,_std::allocator<double>_> *)saved_xmax);
              *(double *)(in_RCX + *(long *)(in_RSI + 0x518) * 8) = dVar4;
            }
          }
        }
      }
      else {
        lVar2 = *(long *)(in_RSI + 0x518) - *(long *)(in_RDI + 8);
        bVar1 = std::vector<double,_std::allocator<double>_>::empty
                          ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30);
        uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff18 >> 0x20);
        uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
        if ((bVar1) &&
           (bVar1 = tsl::
                    robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                    ::empty((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                             *)0x4bc25a), bVar1)) {
          puVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4bc270);
          cat_split_type = (CategSplit)puVar3;
          rnd_generator = *(Xoshiro256PP **)(in_RSI + 0x58);
          in_stack_ffffffffffffffb8 =
               (double *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4bc2ff);
          in_stack_ffffffffffffff18 =
               std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x4bc31b);
          in_stack_ffffffffffffff20 = (undefined4)in_RDX[0x11];
          in_stack_ffffffffffffff30 = (ColumnSampler<long_double> *)(in_RSI + 0x30);
          in_stack_ffffffffffffff28 =
               (ColumnSampler<long_double> *)CONCAT44(uVar6,(int)in_RDX[0x10]);
          dVar4 = calc_kurtosis<long_double>
                            ((size_t *)in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68,
                             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             in_stack_ffffffffffffff58,
                             (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                             in_stack_ffffffffffffff48,in_stack_ffffffffffffff80,
                             in_stack_ffffffffffffff88,cat_split_type,rnd_generator);
          *(double *)(in_RCX + *(long *)(in_RSI + 0x518) * 8) = dVar4;
        }
        else {
          bVar1 = std::vector<double,_std::allocator<double>_>::empty
                            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30);
          if (bVar1) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4bc4f2);
            in_stack_ffffffffffffff48 = *(size_t **)(in_RSI + 0x58);
            in_stack_ffffffffffffff50 = *(undefined8 *)(in_RSI + 0x60);
            in_stack_ffffffffffffff58 =
                 (int *)(*(long *)(in_RDI + 0x10) + lVar2 * *(long *)(in_RDI + 0x30) * 4);
            in_stack_ffffffffffffff64 = *(undefined4 *)(*(long *)(in_RDI + 0x18) + lVar2 * 4);
            std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x4bc575);
            in_stack_ffffffffffffff20 = (undefined4)in_RDX[0x10];
            in_stack_ffffffffffffff28 = (ColumnSampler<long_double> *)(in_RSI + 0x30);
            in_stack_ffffffffffffff30 = (ColumnSampler<long_double> *)(in_RSI + 0x80);
            in_stack_ffffffffffffff18 = (double *)CONCAT44(uVar5,(int)in_RDX[0x11]);
            dVar4 = calc_kurtosis_weighted<tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
                              (in_RDX,in_RCX,in_R8,in_R9,(int)((ulong)lVar2 >> 0x20),
                               in_stack_ffffffffffffffb8,(MissingAction)in_RDI,(CategSplit)unaff_RBX
                               ,unaff_retaddr,in_stack_00000008);
            *(double *)(in_RCX + *(long *)(in_RSI + 0x518) * 8) = dVar4;
          }
          else {
            in_stack_ffffffffffffff68 =
                 (InputData<float,_int> *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4bc3d7);
            in_stack_ffffffffffffff70 =
                 *(WorkerMemory<ImputedData<int,_long_double>,_long_double,_float> **)
                  (in_RSI + 0x58);
            in_stack_ffffffffffffff80 =
                 (double *)(*(long *)(in_RDI + 0x10) + lVar2 * *(long *)(in_RDI + 0x30) * 4);
            std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x4bc45a);
            in_stack_ffffffffffffff20 = (undefined4)in_RDX[0x10];
            in_stack_ffffffffffffff28 = (ColumnSampler<long_double> *)(in_RSI + 0x30);
            in_stack_ffffffffffffff30 = (ColumnSampler<long_double> *)(in_RSI + 0xd0);
            in_stack_ffffffffffffff18 = (double *)CONCAT44(uVar5,(int)in_RDX[0x11]);
            dVar4 = calc_kurtosis_weighted<std::vector<double,std::allocator<double>>,long_double>
                              (in_RDX,in_RCX,in_R8,in_R9,(int)((ulong)lVar2 >> 0x20),
                               in_stack_ffffffffffffffb8,(MissingAction)in_RDI,(CategSplit)unaff_RBX
                               ,unaff_retaddr,
                               (vector<double,_std::allocator<double>_> *)in_stack_00000008);
            *(double *)(in_RCX + *(long *)(in_RSI + 0x518) * 8) = dVar4;
          }
        }
      }
      dVar4 = *(double *)(in_RCX + *(long *)(in_RSI + 0x518) * 8);
      if ((dVar4 == -INFINITY) && (!NAN(dVar4))) {
        ColumnSampler<long_double>::drop_col
                  ((ColumnSampler<long_double> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   (size_t)in_stack_ffffffffffffff18);
      }
      dVar4 = *(double *)(in_RCX + *(long *)(in_RSI + 0x518) * 8);
      if ((dVar4 != -INFINITY) || (NAN(dVar4))) {
        local_c8 = *(double *)(in_RCX + *(long *)(in_RSI + 0x518) * 8) + -1.0;
        if (local_c8 <= 1e-08) {
          local_c8 = 1e-08;
        }
      }
      else {
        local_c8 = 0.0;
      }
      *(double *)(in_RCX + *(long *)(in_RSI + 0x518) * 8) = local_c8;
      if ((*(long *)(in_RDI + 0x50) != 0) &&
         (0.0 < *(double *)(in_RCX + *(long *)(in_RSI + 0x518) * 8))) {
        *(double *)(in_RCX + *(long *)(in_RSI + 0x518) * 8) =
             (double)*(float *)(*(long *)(in_RDI + 0x50) + *(long *)(in_RSI + 0x518) * 4) *
             *(double *)(in_RCX + *(long *)(in_RSI + 0x518) * 8);
        dVar4 = *(double *)(in_RCX + *(long *)(in_RSI + 0x518) * 8);
        if (dVar4 <= 1e-100) {
          dVar4 = 1e-100;
        }
        *(double *)(in_RCX + *(long *)(in_RSI + 0x518) * 8) = dVar4;
      }
    }
    get_split_range<InputData<float,int>,WorkerMemory<ImputedData<int,long_double>,long_double,float>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (ModelParams *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    if ((*(byte *)(in_RSI + 0x108) & 1) == 0) {
      if (in_R8 != 0) {
        *(undefined8 *)(in_R8 + *(long *)(in_RSI + 0x518) * 8) = *(undefined8 *)(in_RSI + 0xf0);
        *(undefined8 *)(in_R9 + *(long *)(in_RSI + 0x518) * 2) = *(undefined8 *)(in_RSI + 0xf8);
      }
      goto LAB_004bbd72;
    }
    ColumnSampler<long_double>::drop_col
              ((ColumnSampler<long_double> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (size_t)in_stack_ffffffffffffff18);
  } while( true );
}

Assistant:

void calc_kurt_all_cols(InputData &input_data, WorkerMemory &workspace, ModelParams &model_params,
                        double *restrict kurtosis, double *restrict saved_xmin, double *restrict saved_xmax)
{
    workspace.col_sampler.prepare_full_pass();
    while (workspace.col_sampler.sample_col(workspace.col_chosen))
    {
        if (saved_xmin != NULL)
        {
            get_split_range(workspace, input_data, model_params);
            if (workspace.unsplittable)
            {
                workspace.col_sampler.drop_col(workspace.col_chosen);
                continue;
            }

            if (saved_xmin != NULL)
            {
                saved_xmin[workspace.col_chosen] = workspace.xmin;
                saved_xmax[workspace.col_chosen] = workspace.xmax;
            }
        }

        if (workspace.col_chosen < input_data.ncols_numeric)
        {
            if (input_data.Xc_indptr == NULL)
            {
                if (workspace.weights_arr.empty() && workspace.weights_map.empty())
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                      ldouble_safe>(
                                      workspace.ix_arr.data(), workspace.st, workspace.end,
                                      input_data.numeric_data + workspace.col_chosen * input_data.nrows,
                                      model_params.missing_action);
                }

                else if (!workspace.weights_arr.empty())
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                               decltype(workspace.weights_arr), ldouble_safe>(
                                               workspace.ix_arr.data(), workspace.st, workspace.end,
                                               input_data.numeric_data + workspace.col_chosen * input_data.nrows,
                                               model_params.missing_action, workspace.weights_arr);
                }

                else
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                               decltype(workspace.weights_map), ldouble_safe>(
                                               workspace.ix_arr.data(), workspace.st, workspace.end,
                                               input_data.numeric_data + workspace.col_chosen * input_data.nrows,
                                               model_params.missing_action, workspace.weights_map);
                }
            }

            else
            {
                if (workspace.weights_arr.empty() && workspace.weights_map.empty())
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                      typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                      ldouble_safe>(
                                      workspace.ix_arr.data(), workspace.st, workspace.end,
                                      workspace.col_chosen,
                                      input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                      model_params.missing_action);
                }

                else if (!workspace.weights_arr.empty())
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                               typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                               decltype(workspace.weights_arr), ldouble_safe>(
                                               workspace.ix_arr.data(), workspace.st, workspace.end,
                                               workspace.col_chosen,
                                               input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                               model_params.missing_action, workspace.weights_arr);
                }

                else
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                               typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                               decltype(workspace.weights_map), ldouble_safe>(
                                               workspace.ix_arr.data(), workspace.st, workspace.end,
                                               workspace.col_chosen,
                                               input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                               model_params.missing_action, workspace.weights_map);
                }
            }
        }

        else
        {
            size_t col = workspace.col_chosen - input_data.ncols_numeric;
            if (workspace.weights_arr.empty() && workspace.weights_map.empty())
            {
                kurtosis[workspace.col_chosen] =
                    calc_kurtosis<ldouble_safe>(
                                  workspace.ix_arr.data(), workspace.st, workspace.end,
                                  input_data.categ_data + col * input_data.nrows,
                                  input_data.ncat[col],
                                  workspace.buffer_szt.data(), workspace.buffer_dbl.data(),
                                  model_params.missing_action, model_params.cat_split_type,
                                  workspace.rnd_generator);
            }

            else if (!workspace.weights_arr.empty())
            {
                kurtosis[workspace.col_chosen] =
                    calc_kurtosis_weighted<decltype(workspace.weights_arr), ldouble_safe>(
                                           workspace.ix_arr.data(), workspace.st, workspace.end,
                                           input_data.categ_data + col * input_data.nrows,
                                           input_data.ncat[col],
                                           workspace.buffer_dbl.data(),
                                           model_params.missing_action, model_params.cat_split_type,
                                           workspace.rnd_generator, workspace.weights_arr);
            }

            else
            {
                kurtosis[workspace.col_chosen] =
                    calc_kurtosis_weighted<decltype(workspace.weights_map), ldouble_safe>(
                                           workspace.ix_arr.data(), workspace.st, workspace.end,
                                           input_data.categ_data + col * input_data.nrows,
                                           input_data.ncat[col],
                                           workspace.buffer_dbl.data(),
                                           model_params.missing_action, model_params.cat_split_type,
                                           workspace.rnd_generator, workspace.weights_map);
            }
        }

        if (kurtosis[workspace.col_chosen] == -HUGE_VAL)
            workspace.col_sampler.drop_col(workspace.col_chosen);

        kurtosis[workspace.col_chosen] = (kurtosis[workspace.col_chosen] == -HUGE_VAL)?
                                            0. : std::fmax(1e-8, -1. + kurtosis[workspace.col_chosen]);
        if (input_data.col_weights != NULL && kurtosis[workspace.col_chosen] > 0)
        {
            kurtosis[workspace.col_chosen] *= input_data.col_weights[workspace.col_chosen];
            kurtosis[workspace.col_chosen] = std::fmax(kurtosis[workspace.col_chosen], 1e-100);
        }
    }
}